

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

void __thiscall SAT::checkConflict(SAT *this)

{
  lbool lVar1;
  bool bVar2;
  uint uVar3;
  Lit *pLVar4;
  Clause *in_RDI;
  uint i;
  uint i_00;
  undefined4 in_stack_ffffffffffffffe8;
  Lit in_stack_fffffffffffffff0;
  uint local_c;
  
  local_c = 0;
  while (i_00 = local_c, uVar3 = Clause::size((Clause *)in_RDI[0x1e]), i_00 < uVar3) {
    pLVar4 = Clause::operator[](in_RDI,i_00);
    lVar1 = value((SAT *)CONCAT44(pLVar4->x,in_stack_ffffffffffffffe8),in_stack_fffffffffffffff0);
    in_stack_fffffffffffffff0.x = CONCAT13(lVar1.value,(int3)in_stack_fffffffffffffff0.x);
    in_stack_ffffffffffffffe8 = CONCAT13(::l_False.value,(int3)in_stack_ffffffffffffffe8);
    bVar2 = lbool::operator!=((lbool *)&stack0xfffffffffffffff3,::l_False);
    if (bVar2) {
      printf("Analyze: %dth lit is not false\n",(ulong)local_c);
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void SAT::checkConflict() const {
	assert(confl != nullptr);
	for (unsigned int i = 0; i < confl->size(); i++) {
		if (value((*confl)[i]) != l_False) {
			printf("Analyze: %dth lit is not false\n", i);
		}
		assert(value((*confl)[i]) == l_False);
	}

	/*
		printf("Clause %d\n", learnts.size());
		printf("Conflict clause: ");
		printClause(*confl);
	*/
}